

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createMemSet
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  Value *val;
  PSNode *n;
  Instruction *pIVar5;
  undefined8 *puVar6;
  PSNode *G;
  PSNode *op;
  PSNode *local_50;
  PSNode *local_48;
  PSNode *local_40;
  PSNode *local_38;
  
  uVar1 = *(uint *)(Inst + 0x14);
  pIVar5 = Inst + -(ulong)(uVar1 << 5);
  lVar3 = *(long *)(pIVar5 + 0x20);
  puVar6 = &UNKNOWN_MEMORY;
  if ((lVar3 != 0) && (*(char *)(lVar3 + 0x10) == '\x10')) {
    uVar2 = *(uint *)(lVar3 + 0x20);
    if (uVar2 < 0x41) {
      if (*(long *)(lVar3 + 0x18) != 0) goto LAB_00121756;
    }
    else {
      uVar4 = llvm::APInt::countLeadingZerosSlowCase();
      if (uVar4 != uVar2) goto LAB_00121756;
    }
    puVar6 = (undefined8 *)&NULLPTR;
  }
LAB_00121756:
  local_50 = (PSNode *)*puVar6;
  if ((uVar1 >> 0x1e & 1) != 0) {
    pIVar5 = *(Instruction **)(Inst + -8);
  }
  val = (Value *)llvm::Value::stripInBoundsOffsets
                           (*(undefined8 *)pIVar5,
                            llvm::function_ref<void(llvm::Value_const*)>::
                            callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                            ,&local_48);
  local_38 = getOperand(this,val);
  local_40 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&>
                       ((PointerGraph *)this,&local_38,&Offset::UNKNOWN);
  n = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                ((PointerGraph *)this,&local_50,&local_40);
  local_48 = local_40;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_repr = (PSNode *)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
  _M_realloc_insert<dg::pta::PSNode*const&>
            ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)__return_storage_ptr__,
             (iterator)0x0,&local_48);
  PSNodesSeq::append(__return_storage_ptr__,n);
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createMemSet(const llvm::Instruction *Inst) {
    PSNode *val;
    if (llvmutils::memsetIsZeroInitialization(
                llvm::cast<llvm::IntrinsicInst>(Inst)))
        val = NULLPTR;
    else
        // if the memset is not 0-initialized, it does some
        // garbage into the pointer
        val = UNKNOWN_MEMORY;

    PSNode *op = getOperand(Inst->getOperand(0)->stripInBoundsOffsets());
    // we need to make unknown offsets
    PSNode *G = PS.create<PSNodeType::GEP>(op, Offset::UNKNOWN);
    PSNode *S = PS.create<PSNodeType::STORE>(val, G);

    PSNodesSeq ret(G);
    ret.append(S);
    // no representant here...

    return ret;
}